

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Matrix.c
# Opt level: O0

char * Llb_MtrVarName(Llb_Mtr_t *p,int iVar)

{
  int iVar_local;
  Llb_Mtr_t *p_local;
  
  if (iVar < p->nPis) {
    strcpy(Llb_MtrVarName::Buffer,"pi");
  }
  else if (iVar < p->nPis + p->nFfs) {
    strcpy(Llb_MtrVarName::Buffer,"CS");
  }
  else if (iVar < p->nRows - p->nFfs) {
    strcpy(Llb_MtrVarName::Buffer,"int");
  }
  else {
    strcpy(Llb_MtrVarName::Buffer,"NS");
  }
  return Llb_MtrVarName::Buffer;
}

Assistant:

char * Llb_MtrVarName( Llb_Mtr_t * p, int iVar )
{
    static char Buffer[10];
    if ( iVar < p->nPis )
        strcpy( Buffer, "pi" );
    else if ( iVar < p->nPis + p->nFfs )
        strcpy( Buffer, "CS" );
    else if ( iVar >= p->nRows - p->nFfs )
        strcpy( Buffer, "NS" );
    else 
        strcpy( Buffer, "int" );
    return Buffer;
}